

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O3

void __thiscall
soplex::DataArray<soplex::SPxSolverBase<double>::VarStatus>::reMax
          (DataArray<soplex::SPxSolverBase<double>::VarStatus> *this,int newMax,int newSize)

{
  int n;
  
  if (-1 < newSize) {
    this->thesize = newSize;
  }
  if (newSize < newMax) {
    newSize = newMax;
  }
  n = 1;
  if (1 < newSize) {
    n = newSize;
  }
  if (n == this->themax) {
    return;
  }
  this->themax = n;
  if (0 < this->thesize) {
    spx_realloc<soplex::SPxSolverBase<double>::VarStatus*>(&this->data,n);
    return;
  }
  free(this->data);
  this->data = (VarStatus *)0x0;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(&this->data,this->themax);
  return;
}

Assistant:

void reMax(int newMax = 1, int newSize = -1)
   {
      if(newSize >= 0)
         thesize = newSize;

      if(newMax < newSize)
         newMax = newSize;

      if(newMax < 1)
         newMax = 1;

      if(newMax == themax)
         return;

      themax = newMax;

      if(thesize <= 0)
      {
         /* no data needs to be copied so do a clean free and alloc */
         spx_free(data);
         spx_alloc(data, themax);
      }
      else
         spx_realloc(data, themax);
   }